

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O1

void WI_Drawer(void)

{
  double dVar1;
  player_t *player;
  DBot *pDVar2;
  FFont *pFVar3;
  DFrameBuffer *pDVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  EColorRange EVar10;
  level_info_t *plVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  FTexture *pFVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar16;
  undefined8 *puVar17;
  code *__compar;
  uint uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  float fVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  float x;
  int iVar28;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uStack_e4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  BYTE *pBStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  FTexture *pFStack_a0;
  undefined8 uStack_98;
  uint uStack_90;
  int iStack_8c;
  undefined8 uStack_88;
  int iStack_7c;
  float afStack_78 [4];
  float fStack_68;
  float fStack_64;
  int iStack_60;
  int iStack_5c;
  ulong uStack_58;
  ulong uStack_50;
  BYTE *pBStack_48;
  FTexture *pFStack_40;
  ulong uStack_38;
  
  if (state == LeavingIntermission) {
    return;
  }
  if (state == ShowNextLoc) {
    WI_drawBackground();
    if ((splat != (FTexture *)0x0) && (lnodes.Count != 0)) {
      lVar21 = 8;
      uVar23 = 0;
      do {
        plVar11 = FindLevelInfo((lnodes.Array)->level + lVar21 + -8,true);
        if ((plVar11 != (level_info_t *)0x0) && ((int)plVar11->flags < 0)) {
          WI_drawOnLnode((int)uVar23,&splat,1);
        }
        uVar23 = uVar23 + 1;
        lVar21 = lVar21 + 0x14;
      } while (uVar23 < lnodes.Count);
    }
    uVar8 = yah.Count;
    if ((snl_pointeron == true) && (yah.Count != 0)) {
      uVar19 = WI_MapToIndex((wbs->next).Chars);
      if (uVar19 < lnodes.Count) {
        WI_drawOnLnode(uVar19,yah.Array,uVar8);
      }
    }
    WI_drawEL();
    return;
  }
  if (state != StatCount) {
    snl_pointeron = true;
    WI_drawShowNextLoc();
    return;
  }
  if (deathmatch.Value != 0) {
    (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
    pFVar13 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
    WI_drawBackground();
    iVar7 = WI_drawLF();
    HU_GetPlayerWidths((int *)&uStack_88,&iStack_8c,(int *)&uStack_90);
    dVar1 = (pFVar13->Scale).Y;
    uVar19 = (uint)((double)((uint)pFVar13->Height * 2) / dVar1);
    uVar8 = (uint)((double)(pFVar13->TopOffset * 2) / dVar1);
    uVar8 = ((uVar19 & 1) + ((int)uVar19 >> 1)) - ((uVar8 & 1) + ((int)uVar8 >> 1));
    if ((int)uVar8 <= (int)uStack_90) {
      uVar8 = uStack_90;
    }
    uVar5 = SmallFont->FontHeight * CleanYfac;
    uVar19 = uVar8 * CleanYfac;
    if ((int)(uVar8 * CleanYfac) < (int)uVar5) {
      uVar19 = uVar5;
    }
    uStack_a8 = (ulong)(uint)(iVar7 + CleanYfac);
    pFStack_a0 = pFVar13;
    uStack_90 = uVar8;
    pBVar14 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_DEATHS");
    pBVar15 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_FRAGS");
    iVar7 = CleanXfac;
    iVar20 = (iStack_8c + 8) * CleanXfac;
    pBStack_b8 = pBVar15;
    iVar27 = FFont::StringWidth(SmallFont,"XXXXX");
    iVar9 = FFont::StringWidth(SmallFont,pBVar15);
    if (iVar9 < iVar27) {
      iVar9 = iVar27;
    }
    iVar25 = ((int)uStack_88 + iVar9 + 8) * CleanXfac + iVar20;
    iVar9 = FFont::StringWidth(SmallFont,pBVar14);
    pDVar4 = screen;
    pFVar3 = SmallFont;
    uStack_b0 = CONCAT44(extraout_var,iVar9);
    uVar18 = (iVar9 + 8) * CleanXfac + iVar25;
    uStack_98 = (ulong)uVar18;
    uVar8 = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar18) >> 1;
    iVar20 = iVar20 + uVar8;
    iVar25 = iVar25 + uVar8;
    iVar27 = uVar8 + uVar18;
    iVar28 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
    pcVar24 = FStringTable::operator()(&GStrings,"SCORE_NAME");
    lVar21 = 0;
    iVar26 = (int)uStack_a8;
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar28,iVar20,iVar26,pcVar24,0x40001393,1,0);
    pBVar15 = pBStack_b8;
    pDVar4 = screen;
    pFVar3 = SmallFont;
    iVar9 = FFont::StringWidth(SmallFont,pBStack_b8);
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar28,iVar25 - iVar9 * CleanXfac,iVar26,
                      (char *)pBVar15,0x40001393,1,0);
    DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar28,iVar27 - (int)uStack_b0 * CleanXfac,iVar26,
                      (char *)pBVar14,0x40001393,1,0);
    puVar17 = &players;
    do {
      *(undefined8 **)(afStack_78 + lVar21 * 2) = puVar17;
      lVar21 = lVar21 + 1;
      puVar17 = puVar17 + 0x54;
    } while (lVar21 != 8);
    if (teamplay.Value == false) {
      __compar = comparepoints;
    }
    else {
      __compar = compareteams;
    }
    iVar28 = (int)((uVar19 - uVar5) + 1) / 2;
    iVar9 = iVar26 + uVar5 + CleanYfac * 6;
    qsort(afStack_78,8,8,__compar);
    lVar21 = 0;
    do {
      player = *(player_t **)(afStack_78 + lVar21 * 2);
      iVar26 = (int)((long)&player[-0x91ab].ConversationNPCAngle >> 5) * 0x3cf3cf3d;
      if (playeringame[iVar26] == true) {
        D_GetPlayerColor(iVar26,(float *)((long)&uStack_c0 + 4),(float *)&uStack_c0,&fStack_c4,
                         (FPlayerColorSet **)0x0);
        HSVtoRGB(&fStack_c8,&fStack_cc,&fStack_d0,uStack_c0._4_4_,(float)uStack_c0,fStack_c4);
        iVar6 = (int)(fStack_c8 * 255.0);
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        iVar16 = (int)(fStack_cc * 255.0);
        if (0xfe < iVar16) {
          iVar16 = 0xff;
        }
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        uVar18 = (uint)(fStack_d0 * 255.0);
        if (0xfe < (int)uVar18) {
          uVar18 = 0xff;
        }
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                  (0x3f4ccccd,screen,(ulong)(uVar18 | iVar16 << 8 | iVar6 << 0x10),(ulong)uVar8,
                   (ulong)(uint)(iVar9 - iVar28),(ulong)(uint)((int)uStack_98 + CleanXfac * 8),
                   (ulong)uVar19);
        if (playerready[iVar26] == false) {
          pDVar2 = (player->Bot).field_0.p;
          if (pDVar2 != (DBot *)0x0) {
            if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0049d01f;
            (player->Bot).field_0.p = (DBot *)0x0;
          }
        }
        else {
LAB_0049d01f:
          DCanvas::DrawTexture
                    ((DCanvas *)screen,pFStack_a0,
                     (double)(int)(uVar8 - (uint)pFStack_a0->Width * CleanXfac),(double)iVar9,
                     0x40001393,1,0);
        }
        EVar10 = HU_GetRowColor(player,consoleplayer == iVar26);
        uVar18 = (player->mo->ScoreIcon).texnum;
        if (0 < (long)(int)uVar18) {
          if (uVar18 < TexMan.Textures.Count) {
            pFVar13 = TexMan.Textures.Array[(int)uVar18].Texture;
          }
          else {
            pFVar13 = (FTexture *)0x0;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)screen,pFVar13,(double)(int)(uVar8 + iVar7 * 8),(double)iVar9,
                     0x40001393,1,0);
        }
        puVar17 = (undefined8 *)
                  ((long)&((player->userinfo).
                           super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                          .Nodes)->Next +
                  (ulong)(((player->userinfo).
                           super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           .Size - 1 & 0x1ea) * 0x18));
        do {
          puVar12 = puVar17;
          puVar17 = (undefined8 *)*puVar12;
        } while (*(int *)(puVar12 + 1) != 0x1ea);
        iVar6 = iVar9 + iVar28;
        DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar10,iVar20,iVar6,
                          *(char **)(puVar12[2] + 0x28),0x40001393,1,0);
        WI_drawNum(SmallFont,iVar25,iVar6,cnt_frags[iVar26],0,false,EVar10);
        if (1 < ng_state) {
          WI_drawNum(SmallFont,iVar27,iVar6,cnt_deaths[iVar26],0,false,EVar10);
        }
        iVar9 = iVar9 + uVar19 + CleanYfac;
      }
      pDVar4 = screen;
      pFVar3 = SmallFont;
      lVar21 = lVar21 + 1;
      if (lVar21 == 8) {
        iVar7 = iVar9 + uVar5 + CleanYfac * 3;
        EVar10 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
        pcVar24 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
        DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,EVar10,iVar20,iVar7,pcVar24,0x40001393,1,0);
        WI_drawNum(SmallFont,iVar25,iVar7,total_frags,0,false,EVar10);
        if (3 < ng_state) {
          WI_drawNum(SmallFont,iVar27,iVar7,total_deaths,0,false,EVar10);
        }
        iVar9 = iVar7 + uVar5 + CleanYfac;
        iVar7 = plrs[me].stime;
        pcVar24 = FStringTable::operator()(&GStrings,"SCORE_LVLTIME");
        FString::FString((FString *)&stack0xffffffffffffff18,pcVar24);
        FString::operator+=((FString *)&stack0xffffffffffffff18,": ");
        iVar7 = (int)(((long)iVar7 * 0x62) / 0xdac);
        mysnprintf((char *)((long)&uStack_88 + 7),9,"%02i:%02i:%02i",(ulong)(uint)(iVar7 / 0xe10),
                   (ulong)(uint)((iVar7 % 0xe10) / 0x3c),(ulong)(uint)(iVar7 % 0x3c));
        FString::operator+=((FString *)&stack0xffffffffffffff18,(char *)((long)&uStack_88 + 7));
        DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar10,uVar8,iVar9,
                          (char *)CONCAT44(uStack_e4,in_stack_ffffffffffffff18),0x40001393,1,0);
        FString::~FString((FString *)&stack0xffffffffffffff18);
        return;
      }
    } while( true );
  }
  if (!multiplayer) {
    WI_drawStats();
    return;
  }
  (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
  pFVar13 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
  WI_drawBackground();
  iVar7 = WI_drawLF();
  HU_GetPlayerWidths(&iStack_5c,&iStack_60,&iStack_8c);
  dVar1 = (pFVar13->Scale).Y;
  uVar8 = (uint)((double)((uint)pFVar13->Height * 2) / dVar1);
  uVar19 = (uint)((double)(pFVar13->TopOffset * 2) / dVar1);
  iVar9 = ((uVar8 & 1) + ((int)uVar8 >> 1)) - ((uVar19 & 1) + ((int)uVar19 >> 1));
  if (iStack_8c < iVar9) {
    iStack_8c = iVar9;
  }
  uStack_98._4_4_ = SmallFont->FontHeight * CleanYfac;
  uStack_90 = iStack_8c * CleanYfac;
  if (iStack_8c * CleanYfac < (int)uStack_98._4_4_) {
    uStack_90 = uStack_98._4_4_;
  }
  uStack_50 = (ulong)(uint)((int)(((uStack_90 - uStack_98._4_4_) -
                                  ((int)((uStack_90 - uStack_98._4_4_) + 1) >> 0x1f)) + 1) >> 1);
  uStack_88 = (double)(ulong)(uint)(iVar7 + CleanYfac);
  pcVar24 = "SCORE_BONUS";
  if (((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) {
    pcVar24 = "SCORE_ITEMS";
  }
  pFStack_40 = pFVar13;
  pBVar14 = (BYTE *)FStringTable::operator()(&GStrings,pcVar24);
  pFStack_a0 = (FTexture *)pBVar14;
  pBStack_b8 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_SECRET");
  pBVar15 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_KILLS");
  uStack_c0 = (double)(ulong)(uint)CleanXfac;
  iVar27 = (iStack_60 + 8) * CleanXfac;
  pBStack_48 = pBVar15;
  iVar9 = FFont::StringWidth(SmallFont,"XXXXX");
  iVar7 = FFont::StringWidth(SmallFont,pBVar15);
  if (iVar7 < iVar9) {
    iVar7 = iVar9;
  }
  iVar7 = (iStack_5c + iVar7 + 8) * CleanXfac + iVar27;
  uStack_a8._0_4_ = FFont::StringWidth(SmallFont,pBVar14);
  iVar20 = ((int)uStack_a8 + 8) * CleanXfac + iVar7;
  uStack_a8._4_4_ = extraout_var_00;
  uStack_b0._0_4_ = FFont::StringWidth(SmallFont,pBStack_b8);
  pDVar4 = screen;
  pFVar3 = SmallFont;
  uVar8 = ((int)uStack_b0 + 8) * CleanXfac + iVar20;
  uStack_38 = (ulong)uVar8;
  uVar19 = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar8) >> 1;
  uStack_58 = (ulong)uVar19;
  uStack_c0 = (double)CONCAT44(uStack_c0._4_4_,uVar19 + SUB84(uStack_c0,0) * 8);
  x = (float)(iVar27 + uVar19);
  fVar22 = (float)(iVar7 + uVar19);
  iVar20 = iVar20 + uVar19;
  fStack_cc = (float)(uVar19 + uVar8);
  iVar7 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
  iStack_7c = iVar7;
  uStack_b0._4_4_ = extraout_var_01;
  pcVar24 = FStringTable::operator()(&GStrings,"SCORE_NAME");
  iVar27 = SUB84(uStack_88,0);
  fStack_c4 = x;
  DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar7,(int)x,iVar27,pcVar24,0x40001393);
  pBVar14 = pBStack_48;
  pDVar4 = screen;
  pFVar3 = SmallFont;
  iVar9 = FFont::StringWidth(SmallFont,pBStack_48);
  iVar7 = iStack_7c;
  fStack_c8 = fVar22;
  DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iStack_7c,(int)fVar22 - iVar9 * CleanXfac,iVar27,
                    (char *)pBVar14,0x40001393);
  iVar9 = (int)uStack_a8 * CleanXfac;
  uStack_a8 = CONCAT44(uStack_a8._4_4_,iVar20);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,iVar20 - iVar9,iVar27,(char *)pFStack_a0,
                    0x40001393);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,(int)fStack_cc - (int)uStack_b0 * CleanXfac,
                    iVar27,(char *)pBStack_b8,0x40001393);
  iVar7 = iVar27 + uStack_98._4_4_ + CleanYfac * 6;
  pBStack_b8 = (BYTE *)CONCAT44(pBStack_b8._4_4_,wbs->maxkills);
  pFStack_a0 = (FTexture *)CONCAT44(pFStack_a0._4_4_,wbs->maxitems);
  uStack_b0 = CONCAT44(uStack_b0._4_4_,wbs->maxsecret);
  uStack_88 = (double)(int)(float)uStack_c0;
  uVar23 = 0;
  do {
    if (playeringame[uVar23] == true) {
      D_GetPlayerColor((int)uVar23,&fStack_64,&fStack_68,afStack_78 + 3,(FPlayerColorSet **)0x0);
      HSVtoRGB(afStack_78 + 2,afStack_78 + 1,afStack_78,fStack_64,fStack_68,afStack_78[3]);
      iVar9 = (int)(afStack_78[2] * 255.0);
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      iVar27 = (int)(afStack_78[1] * 255.0);
      if (0xfe < iVar27) {
        iVar27 = 0xff;
      }
      if (iVar27 < 1) {
        iVar27 = 0;
      }
      uVar8 = (uint)(afStack_78[0] * 255.0);
      if (0xfe < (int)uVar8) {
        uVar8 = 0xff;
      }
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f4ccccd,screen,(ulong)(uVar8 | iVar27 << 8 | iVar9 << 0x10),uStack_58,
                 (ulong)(uint)(iVar7 - (int)uStack_50),(ulong)(uint)((int)uStack_38 + CleanXfac * 8)
                 ,(ulong)uStack_90);
      uStack_c0 = (double)iVar7;
      if (playerready[uVar23] == false) {
        if ((&DAT_017e5fe8)[uVar23 * 0x54] != 0) {
          if ((*(byte *)((&DAT_017e5fe8)[uVar23 * 0x54] + 0x20) & 0x20) == 0) goto LAB_0049df3d;
          (&DAT_017e5fe8)[uVar23 * 0x54] = 0;
        }
      }
      else {
LAB_0049df3d:
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFStack_40,
                   (double)(int)((int)uStack_58 - (uint)pFStack_40->Width * CleanXfac),uStack_c0,
                   0x40001393,1,0);
      }
      EVar10 = HU_GetRowColor((player_t *)(&players + uVar23 * 0x54),uVar23 == (uint)consoleplayer);
      uVar8 = (((player_t *)(&players + uVar23 * 0x54))->mo->ScoreIcon).texnum;
      if (0 < (long)(int)uVar8) {
        if (uVar8 < TexMan.Textures.Count) {
          pFVar13 = TexMan.Textures.Array[(int)uVar8].Texture;
        }
        else {
          pFVar13 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture((DCanvas *)screen,pFVar13,uStack_88,uStack_c0,0x40001393,1,0);
      }
      puVar17 = (undefined8 *)
                ((ulong)(((&DAT_017e5e98)[uVar23 * 0xa8] - 1 & 0x1ea) * 0x18) +
                (&DAT_017e5e88)[uVar23 * 0x54]);
      do {
        puVar12 = puVar17;
        puVar17 = (undefined8 *)*puVar12;
      } while (*(int *)(puVar12 + 1) != 0x1ea);
      iVar9 = (int)uStack_50 + iVar7;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar10,(int)fStack_c4,iVar9,
                        *(char **)(puVar12[2] + 0x28),0x40001393);
      WI_drawPercent(SmallFont,(int)fStack_c8,iVar9,cnt_kills[uVar23],wbs->maxkills,false,EVar10);
      pBStack_b8 = (BYTE *)CONCAT44(pBStack_b8._4_4_,(int)pBStack_b8 - cnt_kills[uVar23]);
      if (3 < ng_state) {
        WI_drawPercent(SmallFont,(int)uStack_a8,iVar9,cnt_items[uVar23],wbs->maxitems,false,EVar10);
        pFStack_a0 = (FTexture *)CONCAT44(pFStack_a0._4_4_,(int)pFStack_a0 - cnt_items[uVar23]);
        if (5 < ng_state) {
          WI_drawPercent(SmallFont,(int)fStack_cc,iVar9,cnt_secret[uVar23],wbs->maxsecret,false,
                         EVar10);
          uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)uStack_b0 - cnt_secret[uVar23]);
        }
      }
      iVar7 = iVar7 + uStack_90 + CleanYfac;
    }
    pDVar4 = screen;
    pFVar3 = SmallFont;
    uVar23 = uVar23 + 1;
    if (uVar23 == 8) {
      iVar7 = CleanYfac * 3 + iVar7;
      pcVar24 = FStringTable::operator()(&GStrings,"SCORE_MISSED");
      DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,0x14,(int)fStack_c4,iVar7,pcVar24,0x40001393);
      WI_drawPercent(SmallFont,(int)fStack_c8,iVar7,(int)pBStack_b8,wbs->maxkills,false,CR_DARKGRAY)
      ;
      if (3 < ng_state) {
        WI_drawPercent(SmallFont,(int)uStack_a8,iVar7,(int)pFStack_a0,wbs->maxitems,false,
                       CR_DARKGRAY);
        if (5 < ng_state) {
          WI_drawPercent(SmallFont,(int)fStack_cc,iVar7,(int)uStack_b0,wbs->maxsecret,false,
                         CR_DARKGRAY);
        }
      }
      pDVar4 = screen;
      pFVar3 = SmallFont;
      iVar7 = iVar7 + uStack_98._4_4_ + CleanYfac * 3;
      EVar10 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
      pcVar24 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
      DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,EVar10,(int)fStack_c4,iVar7,pcVar24,0x40001393);
      WI_drawNum(SmallFont,(int)fStack_c8,iVar7,wbs->maxkills,0,false,EVar10);
      if (3 < ng_state) {
        WI_drawNum(SmallFont,(int)uStack_a8,iVar7,wbs->maxitems,0,false,EVar10);
        if (5 < ng_state) {
          WI_drawNum(SmallFont,(int)fStack_cc,iVar7,wbs->maxsecret,0,false,EVar10);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void WI_Drawer (void)
{
	switch (state)
	{
	case StatCount:
		if (deathmatch)
			WI_drawDeathmatchStats();
		else if (multiplayer)
			WI_drawNetgameStats();
		else
			WI_drawStats();
		break;
	
	case ShowNextLoc:
		WI_drawShowNextLoc();
		break;
	
	case LeavingIntermission:
		break;

	default:
		WI_drawNoState();
		break;
	}
}